

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O1

void re2::RE2DeepRecursion(void)

{
  bool bVar1;
  string comment;
  string a;
  RE2 re;
  char *local_2b8;
  int local_2b0;
  char local_2a8 [16];
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  RE2 local_278;
  LogMessage local_198;
  
  local_2b8 = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"x*","");
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct((ulong)local_298,'\0');
  std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_298[0]);
  std::__cxx11::string::append((char *)&local_2b8);
  RE2::RE2(&local_278,"((?:\\s|xx.*\n|x[*](?:\n|.)*?[*]x)*)");
  local_198._0_8_ = local_2b8;
  local_198._8_4_ = local_2b0;
  bVar1 = RE2::FullMatchN((StringPiece *)&local_198,&local_278,(Arg **)0x0,0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4c4,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_198 + 8),"Check failed: RE2::FullMatch(comment, re)",0x29);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  RE2::~RE2(&local_278);
  if (local_298[0] != local_288) {
    operator_delete(local_298[0]);
  }
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8);
  }
  return;
}

Assistant:

TEST(CheckRewriteString, all) {
  TestCheckRewriteString("abc", "foo", true);
  TestCheckRewriteString("abc", "foo\\", false);
  TestCheckRewriteString("abc", "foo\\0bar", true);

  TestCheckRewriteString("a(b)c", "foo", true);
  TestCheckRewriteString("a(b)c", "foo\\0bar", true);
  TestCheckRewriteString("a(b)c", "foo\\1bar", true);
  TestCheckRewriteString("a(b)c", "foo\\2bar", false);
  TestCheckRewriteString("a(b)c", "f\\\\2o\\1o", true);

  TestCheckRewriteString("a(b)(c)", "foo\\12", true);
  TestCheckRewriteString("a(b)(c)", "f\\2o\\1o", true);
  TestCheckRewriteString("a(b)(c)", "f\\oo\\1", false);
}